

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_TokenWithCCM_Test::~InterpreterTestSuite_PC_TokenWithCCM_Test
          (InterpreterTestSuite_PC_TokenWithCCM_Test *this)

{
  InterpreterTestSuite_PC_TokenWithCCM_Test *this_local;
  
  ~InterpreterTestSuite_PC_TokenWithCCM_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_TokenWithCCM)
{
    TestContext ctx;
    InitContext(ctx);

    // prepare CCM network record
    const std::string kDomainName  = "domain1";
    const std::string kNetworkName = "net1";
    const std::string kSmPath      = "./tmp/dom/" + kDomainName + "/";
    uint64_t          xpanCcm      = 1;

    BorderAgent::State baStateCcm{BorderAgent::State::ConnectionMode::kX509Connection, 0, 0, 0, 0};

    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", baStateCcm, kNetworkName, xpanCcm,
                                             "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, kDomainName, 0, 0, "", 0,
                                             0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
              RegistryStatus::kSuccess);

    // prepare fake SM for the CCM network
    std::vector<std::pair<std::string, std::string>> smFiles = {{"ca", kSmPath + "ca.pem"},
                                                                {"key", kSmPath + "priv.pem"},
                                                                {"cert", kSmPath + "cert.pem"},
                                                                {"123aef", kSmPath + "tok.cbor"}};

    EXPECT_EQ(RestoreFilePath(smFiles.front().second).GetCode(), ErrorCode::kNone);
    for (auto smFile : smFiles)
    {
        EXPECT_EQ(WriteFile(smFile.first, smFile.second).GetCode(), ErrorCode::kNone);
    }

    Interpreter::Expression expr;
    Interpreter::Value      value;

    CommissionerAppMockPtr pcaMock{new CommissionerAppMock()};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .WillOnce(DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = pcaMock; }), Return(Error{})));
    EXPECT_CALL(*pcaMock, RequestToken(_, _)).WillOnce(Return(Error{}));
    // note: we do not expect GetToken() here because no default
    //       config update to happen with a network selected

    EXPECT_EQ(ctx.mInterpreter.mRegistry->SetCurrentNetwork(xpanCcm), RegistryStatus::kSuccess);
    expr  = ctx.mInterpreter.ParseExpression("token request 127.0.0.1 2001");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError()) << "value is " << value.ToString();

    const ByteArray token = {'1', '2', '3', 'a', 'e', 'f'};

    EXPECT_CALL(*pcaMock, SetToken(_)).WillOnce(Return(Error{}));
    // note: again, we do not expect GetToken() here, same reason

    EXPECT_EQ(WriteFile("123aef", "./tmp/token").GetCode(), ErrorCode::kNone);
    expr  = ctx.mInterpreter.ParseExpression("token set ./tmp/token");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}